

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::CFIReaderImpl::parseNonIdentifyingStringOrIndex3
          (CFIReaderImpl *this,
          vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
          *valueTable)

{
  element_type *peVar1;
  size_t __n;
  size_type sVar2;
  DeadlyImportError *this_00;
  reference pvVar3;
  vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
  *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  shared_ptr<const_Assimp::FIValue> sVar5;
  size_t index;
  uint8_t b;
  vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
  *valueTable_local;
  CFIReaderImpl *this_local;
  shared_ptr<const_Assimp::FIValue> *result;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  peVar1 = (((valueTable->
             super__Vector_base<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
             )._M_impl.super__Vector_impl_data._M_end_of_storage)->
           super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (((ulong)peVar1 & 0x20) == 0) {
    sVar5 = parseEncodedCharacterString5(this);
    _Var4 = sVar5.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    if (((ulong)peVar1 & 0x10) != 0) {
      std::
      vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
      ::push_back(in_RDX,(value_type *)this);
      _Var4._M_pi = extraout_RDX_00;
    }
  }
  else {
    __n = parseInt4((CFIReaderImpl *)valueTable);
    sVar2 = std::
            vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
            ::size(in_RDX);
    if (sVar2 <= __n) {
      this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      DeadlyImportError::DeadlyImportError(this_00,(string *)parseErrorMessage_abi_cxx11_);
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    pvVar3 = std::
             vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
             ::operator[](in_RDX,__n);
    std::shared_ptr<const_Assimp::FIValue>::shared_ptr
              ((shared_ptr<const_Assimp::FIValue> *)this,pvVar3);
    _Var4._M_pi = extraout_RDX;
  }
  sVar5.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar5.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_Assimp::FIValue>)
         sVar5.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const FIValue> parseNonIdentifyingStringOrIndex3(std::vector<std::shared_ptr<const FIValue>> &valueTable) { // C.15
        uint8_t b = *dataP;
        if (b & 0x20) { // C.15.4
            // We have an index
            size_t index = parseInt4();
            if (index >= valueTable.size()) {
                throw DeadlyImportError(parseErrorMessage);
            }
            return valueTable[index];
        }
        else { // C.15.3
            // We have a literal
            std::shared_ptr<const FIValue> result = parseEncodedCharacterString5();
            if (b & 0x10) { // C.15.3.1
                valueTable.push_back(result);
            }
            return result;
        }
    }